

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O1

void __thiscall
btMultiBody::calcAccelerationDeltasMultiDof
          (btMultiBody *this,btScalar *force,btScalar *output,btAlignedObjectArray<float> *scratch_r
          ,btAlignedObjectArray<btVector3> *scratch_v)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  float *pfVar10;
  btSpatialForceVector *outVec;
  btMatrix3x3 *pbVar11;
  btMultibodyLink *pbVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  btVector3 bVar16;
  long lVar17;
  float *pfVar18;
  btVector3 *pbVar19;
  btVector3 *pbVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  btScalar *pbVar24;
  btSpatialForceVector *pbVar25;
  int dof2;
  int iVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  btSpatialMotionVector *outVec_00;
  float fVar31;
  btScalar bVar32;
  float fVar33;
  btScalar bVar34;
  float fVar35;
  float fVar36;
  undefined8 uVar37;
  btSpatialForceVector local_50;
  
  iVar7 = (this->m_links).m_size;
  lVar17 = (long)iVar7;
  iVar30 = this->m_dofCount;
  iVar8 = scratch_r->m_size;
  if ((iVar8 <= iVar30) && (iVar8 < iVar30)) {
    if (scratch_r->m_capacity < iVar30) {
      if (iVar30 == 0) {
        pfVar18 = (float *)0x0;
      }
      else {
        pfVar18 = (float *)btAlignedAllocInternal((long)iVar30 * 4,0x10);
      }
      iVar9 = scratch_r->m_size;
      if (0 < (long)iVar9) {
        pfVar10 = scratch_r->m_data;
        lVar23 = 0;
        do {
          pfVar18[lVar23] = pfVar10[lVar23];
          lVar23 = lVar23 + 1;
        } while (iVar9 != lVar23);
      }
      if (scratch_r->m_data != (float *)0x0) {
        if (scratch_r->m_ownsMemory == true) {
          btAlignedFreeInternal(scratch_r->m_data);
        }
        scratch_r->m_data = (float *)0x0;
      }
      scratch_r->m_ownsMemory = true;
      scratch_r->m_data = pfVar18;
      scratch_r->m_capacity = iVar30;
    }
    if (iVar8 < iVar30) {
      memset(scratch_r->m_data + iVar8,0,((long)iVar30 - (long)iVar8) * 4);
    }
  }
  scratch_r->m_size = iVar30;
  lVar23 = lVar17 * 4 + 4;
  iVar30 = (int)lVar23;
  if ((scratch_v->m_size < iVar30) && (scratch_v->m_capacity < iVar30)) {
    if (iVar30 == 0) {
      pbVar19 = (btVector3 *)0x0;
    }
    else {
      pbVar19 = (btVector3 *)btAlignedAllocInternal(lVar23 * 0x10,0x10);
    }
    iVar8 = scratch_v->m_size;
    if (0 < (long)iVar8) {
      lVar23 = 0;
      do {
        puVar1 = (undefined8 *)((long)scratch_v->m_data->m_floats + lVar23);
        uVar37 = puVar1[1];
        puVar2 = (undefined8 *)((long)pbVar19->m_floats + lVar23);
        *puVar2 = *puVar1;
        puVar2[1] = uVar37;
        lVar23 = lVar23 + 0x10;
      } while ((long)iVar8 * 0x10 != lVar23);
    }
    if (scratch_v->m_data != (btVector3 *)0x0) {
      if (scratch_v->m_ownsMemory == true) {
        btAlignedFreeInternal(scratch_v->m_data);
      }
      scratch_v->m_data = (btVector3 *)0x0;
    }
    scratch_v->m_ownsMemory = true;
    scratch_v->m_data = pbVar19;
    scratch_v->m_capacity = iVar30;
  }
  scratch_v->m_size = iVar30;
  lVar23 = (long)this->m_dofCount;
  outVec = (btSpatialForceVector *)scratch_v->m_data;
  pfVar18 = scratch_r->m_data;
  if (lVar23 == 0) {
    pfVar18 = (float *)0x0;
  }
  pbVar11 = (this->m_matrixBuf).m_data;
  pbVar19 = (this->m_vectorBuf).m_data;
  if (lVar23 < 1) {
    pbVar19 = (btVector3 *)0x0;
  }
  pbVar20 = (btVector3 *)((this->m_realBuf).m_data + lVar23 + 6);
  if (lVar23 < 1) {
    pbVar20 = (btVector3 *)0x0;
  }
  if (calcAccelerationDeltasMultiDof(float_const*,float*,btAlignedObjectArray<float>&,btAlignedObjectArray<btVector3>&)
      ::result == '\0') {
    calcAccelerationDeltasMultiDof();
  }
  if (calcAccelerationDeltasMultiDof(float_const*,float*,btAlignedObjectArray<float>&,btAlignedObjectArray<btVector3>&)
      ::spatForceVecTemps == '\0') {
    calcAccelerationDeltasMultiDof();
  }
  if (calcAccelerationDeltasMultiDof(float_const*,float*,btAlignedObjectArray<float>&,btAlignedObjectArray<btVector3>&)
      ::fromParent == '\0') {
    calcAccelerationDeltasMultiDof();
  }
  if (this->m_fixedBase == true) {
    (outVec->m_bottomVec).m_floats[0] = 0.0;
    (outVec->m_bottomVec).m_floats[1] = 0.0;
    (outVec->m_bottomVec).m_floats[2] = 0.0;
    (outVec->m_bottomVec).m_floats[3] = 0.0;
    (outVec->m_topVec).m_floats[0] = 0.0;
    (outVec->m_topVec).m_floats[1] = 0.0;
    (outVec->m_topVec).m_floats[2] = 0.0;
    (outVec->m_topVec).m_floats[3] = 0.0;
  }
  else {
    calcAccelerationDeltasMultiDof::fromParent.m_rotMat.m_el[0].m_floats =
         *&pbVar11->m_el[0].m_floats;
    calcAccelerationDeltasMultiDof::fromParent.m_rotMat.m_el[1].m_floats =
         *&pbVar11->m_el[1].m_floats;
    calcAccelerationDeltasMultiDof::fromParent.m_rotMat.m_el[2].m_floats =
         *&pbVar11->m_el[2].m_floats;
    local_50.m_bottomVec.m_floats[2] = -force[2];
    local_50.m_topVec.m_floats[2] = -force[5];
    local_50.m_bottomVec.m_floats._0_8_ = *(ulong *)force ^ 0x8000000080000000;
    local_50.m_bottomVec.m_floats[3] = 0.0;
    local_50.m_topVec.m_floats._0_8_ = *(ulong *)(force + 3) ^ 0x8000000080000000;
    local_50.m_topVec.m_floats[3] = 0.0;
    btSpatialTransformationMatrix::transformRotationOnly<btSpatialForceVector>
              (&calcAccelerationDeltasMultiDof::fromParent,&local_50,outVec,None);
  }
  if (0 < iVar7) {
    memset(outVec + 1,0,lVar17 * 0x20);
    lVar29 = lVar17 * 600 + -0x1b8;
    lVar23 = lVar17;
    do {
      lVar22 = lVar23 + -1;
      pbVar12 = (this->m_links).m_data;
      iVar30 = pbVar12[lVar22].m_parent;
      calcAccelerationDeltasMultiDof::fromParent.m_rotMat.m_el[0].m_floats =
           *&pbVar11[lVar23].m_el[0].m_floats;
      calcAccelerationDeltasMultiDof::fromParent.m_rotMat.m_el[1].m_floats =
           *&pbVar11[lVar23].m_el[1].m_floats;
      calcAccelerationDeltasMultiDof::fromParent.m_rotMat.m_el[2].m_floats =
           *&pbVar11[lVar23].m_el[2].m_floats;
      calcAccelerationDeltasMultiDof::fromParent.m_trnVec.m_floats =
           *&pbVar12[lVar22].m_cachedRVector.m_floats;
      pbVar12 = (this->m_links).m_data;
      iVar8 = pbVar12[lVar22].m_dofCount;
      lVar21 = (long)iVar8;
      if (0 < lVar21) {
        iVar9 = pbVar12[lVar22].m_dofOffset;
        pbVar25 = outVec + lVar23;
        iVar26 = iVar9 + 6;
        lVar28 = 0;
        do {
          *(float *)((long)pfVar18 + lVar28 + (long)iVar9 * 4) =
               force[iVar26] -
               ((pbVar25->m_bottomVec).m_floats[2] *
                *(float *)((long)(pbVar12->m_inertiaLocal).m_floats + lVar28 * 8 + lVar29 + -0x14) +
                (pbVar25->m_bottomVec).m_floats[0] *
                *(float *)((long)(pbVar12->m_inertiaLocal).m_floats + lVar28 * 8 + lVar29 + -0x1c) +
                (pbVar25->m_bottomVec).m_floats[1] *
                *(float *)((long)(pbVar12->m_inertiaLocal).m_floats + lVar28 * 8 + lVar29 + -0x18) +
               (pbVar25->m_topVec).m_floats[2] *
               *(float *)((long)(pbVar12->m_inertiaLocal).m_floats + lVar28 * 8 + lVar29 + -4) +
               (pbVar25->m_topVec).m_floats[0] *
               *(float *)((long)(pbVar12->m_inertiaLocal).m_floats + lVar28 * 8 + lVar29 + -0xc) +
               (pbVar25->m_topVec).m_floats[1] *
               *(float *)((long)(pbVar12->m_inertiaLocal).m_floats + lVar28 * 8 + lVar29 + -8));
          lVar28 = lVar28 + 4;
          iVar26 = iVar26 + 1;
        } while (lVar21 * 4 - lVar28 != 0);
      }
      if (0 < iVar8) {
        iVar8 = pbVar12[lVar22].m_dofOffset;
        pbVar24 = pbVar20->m_floats + (uint)(iVar8 * iVar8);
        lVar28 = 0;
        do {
          calcAccelerationDeltasMultiDof::invD_times_Y[lVar28] = 0.0;
          fVar31 = 0.0;
          lVar27 = 0;
          do {
            fVar31 = fVar31 + pbVar24[lVar27] * pfVar18[iVar8 + lVar27];
            lVar27 = lVar27 + 1;
          } while (lVar21 != lVar27);
          calcAccelerationDeltasMultiDof::invD_times_Y[lVar28] = fVar31;
          lVar28 = lVar28 + 1;
          pbVar24 = pbVar24 + lVar21;
        } while (lVar28 != lVar21);
      }
      calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_topVec.m_floats =
           *&outVec[lVar23].m_topVec.m_floats;
      calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_bottomVec.m_floats =
           *&outVec[lVar23].m_bottomVec.m_floats;
      pbVar12 = (this->m_links).m_data;
      lVar21 = (long)pbVar12[lVar22].m_dofCount;
      if (0 < lVar21) {
        fVar31 = calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_bottomVec.m_floats[0];
        fVar33 = calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_bottomVec.m_floats[1];
        lVar28 = (long)pbVar12[lVar22].m_dofOffset;
        lVar27 = 0;
        bVar32 = calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_bottomVec.m_floats[2];
        bVar34 = calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_topVec.m_floats[2];
        uVar37 = calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_topVec.m_floats._0_8_;
        do {
          bVar16.m_floats =
               calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_bottomVec.m_floats;
          fVar35 = *(float *)((long)calcAccelerationDeltasMultiDof::invD_times_Y + lVar27);
          bVar32 = bVar32 + pbVar19[lVar28 * 2 + 1].m_floats[lVar27 * 2 + 2] * fVar35;
          bVar34 = bVar34 + pbVar19[lVar28 * 2].m_floats[lVar27 * 2 + 2] * fVar35;
          fVar36 = SUB84(uVar37,4);
          uVar37._0_4_ = (float)uVar37 +
                         (float)*(undefined8 *)(pbVar19[lVar28 * 2].m_floats + lVar27 * 2) * fVar35;
          uVar37._4_4_ = fVar36 + (float)((ulong)*(undefined8 *)
                                                  (pbVar19[lVar28 * 2].m_floats + lVar27 * 2) >>
                                         0x20) * fVar35;
          fVar31 = fVar31 + (float)*(undefined8 *)(pbVar19[lVar28 * 2 + 1].m_floats + lVar27 * 2) *
                            fVar35;
          fVar33 = fVar33 + (float)((ulong)*(undefined8 *)
                                            (pbVar19[lVar28 * 2 + 1].m_floats + lVar27 * 2) >> 0x20)
                            * fVar35;
          calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_topVec.m_floats[2] = bVar34;
          calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_topVec.m_floats[0] = (float)uVar37;
          calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_topVec.m_floats[1] = uVar37._4_4_;
          calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_bottomVec.m_floats[1] = fVar33;
          calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_bottomVec.m_floats[0] = fVar31;
          calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_bottomVec.m_floats[3] =
               bVar16.m_floats[3];
          calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_bottomVec.m_floats[2] = bVar32;
          lVar27 = lVar27 + 4;
        } while (lVar21 * 4 != lVar27);
      }
      btSpatialTransformationMatrix::transformInverse<btSpatialForceVector>
                (&calcAccelerationDeltasMultiDof::fromParent,
                 calcAccelerationDeltasMultiDof::spatForceVecTemps,
                 calcAccelerationDeltasMultiDof::spatForceVecTemps + 1,None);
      btSpatialForceVector::operator+=
                (outVec + (long)iVar30 + 1,calcAccelerationDeltasMultiDof::spatForceVecTemps + 1);
      lVar29 = lVar29 + -600;
      bVar13 = 1 < lVar23;
      lVar23 = lVar22;
    } while (bVar13);
  }
  pbVar25 = outVec + lVar17 + 1;
  if (this->m_fixedBase == false) {
    solveImatrix(this,outVec,&calcAccelerationDeltasMultiDof::result);
    uVar37 = calcAccelerationDeltasMultiDof::result.m_bottomVec.m_floats._0_8_;
    bVar32 = -calcAccelerationDeltasMultiDof::result.m_bottomVec.m_floats[2];
    auVar14._8_4_ = -calcAccelerationDeltasMultiDof::result.m_topVec.m_floats[2];
    auVar14._0_8_ =
         calcAccelerationDeltasMultiDof::result.m_topVec.m_floats._0_8_ ^ 0x8000000080000000;
    auVar14._12_4_ = 0;
    *(undefined1 (*) [16])outVec[lVar17 + 1].m_topVec.m_floats = auVar14;
    auVar15._8_4_ = bVar32;
    auVar15._0_8_ = uVar37 ^ 0x8000000080000000;
    auVar15._12_4_ = 0;
    *(undefined1 (*) [16])outVec[lVar17 + 1].m_bottomVec.m_floats = auVar15;
  }
  else {
    outVec[lVar17 + 1].m_bottomVec.m_floats[0] = 0.0;
    outVec[lVar17 + 1].m_bottomVec.m_floats[1] = 0.0;
    outVec[lVar17 + 1].m_bottomVec.m_floats[2] = 0.0;
    outVec[lVar17 + 1].m_bottomVec.m_floats[3] = 0.0;
    (pbVar25->m_topVec).m_floats[0] = 0.0;
    (pbVar25->m_topVec).m_floats[1] = 0.0;
    outVec[lVar17 + 1].m_topVec.m_floats[2] = 0.0;
    outVec[lVar17 + 1].m_topVec.m_floats[3] = 0.0;
  }
  if (0 < iVar7) {
    lVar29 = 0xa0;
    lVar23 = 0;
    do {
      pbVar12 = (this->m_links).m_data;
      lVar21 = lVar23 + 1;
      calcAccelerationDeltasMultiDof::fromParent.m_rotMat.m_el[0].m_floats =
           *&pbVar11[lVar21].m_el[0].m_floats;
      calcAccelerationDeltasMultiDof::fromParent.m_rotMat.m_el[1].m_floats =
           *&pbVar11[lVar21].m_el[1].m_floats;
      calcAccelerationDeltasMultiDof::fromParent.m_rotMat.m_el[2].m_floats =
           *&pbVar11[lVar21].m_el[2].m_floats;
      calcAccelerationDeltasMultiDof::fromParent.m_trnVec.m_floats =
           *&pbVar12[lVar23].m_cachedRVector.m_floats;
      outVec_00 = (btSpatialMotionVector *)(pbVar25 + lVar21);
      btSpatialTransformationMatrix::transform<btSpatialMotionVector>
                (&calcAccelerationDeltasMultiDof::fromParent,
                 (btSpatialMotionVector *)(outVec + lVar17 + (long)pbVar12[lVar23].m_parent + 2),
                 outVec_00,None);
      pbVar12 = (this->m_links).m_data;
      iVar7 = pbVar12[lVar23].m_dofCount;
      lVar22 = (long)iVar7;
      if (0 < lVar22) {
        lVar28 = (long)pbVar12[lVar23].m_dofOffset;
        fVar31 = (outVec_00->m_bottomVec).m_floats[1];
        fVar33 = (outVec_00->m_topVec).m_floats[0];
        fVar35 = (outVec_00->m_topVec).m_floats[1];
        fVar36 = (outVec_00->m_topVec).m_floats[2];
        fVar3 = (outVec_00->m_bottomVec).m_floats[0];
        fVar4 = (outVec_00->m_bottomVec).m_floats[2];
        lVar27 = 0;
        do {
          *(float *)((long)calcAccelerationDeltasMultiDof::Y_minus_hT_a + lVar27) =
               *(float *)((long)pfVar18 + lVar27 + lVar28 * 4) -
               (pbVar19[lVar28 * 2 + 1].m_floats[lVar27 * 2 + 2] * fVar36 +
                pbVar19[lVar28 * 2 + 1].m_floats[lVar27 * 2] * fVar33 +
                pbVar19[lVar28 * 2 + 1].m_floats[lVar27 * 2 + 1] * fVar35 +
               pbVar19[lVar28 * 2].m_floats[lVar27 * 2 + 2] * fVar4 +
               pbVar19[lVar28 * 2].m_floats[lVar27 * 2] * fVar3 +
               pbVar19[lVar28 * 2].m_floats[lVar27 * 2 + 1] * fVar31);
          lVar27 = lVar27 + 4;
        } while (lVar22 * 4 - lVar27 != 0);
      }
      iVar30 = pbVar12[lVar23].m_dofOffset;
      lVar23 = (long)iVar30;
      if (0 < iVar7) {
        pbVar24 = pbVar20->m_floats + (uint)(iVar30 * iVar30);
        lVar28 = 0;
        do {
          output[lVar23 + lVar28 + 6] = 0.0;
          fVar31 = 0.0;
          lVar27 = 0;
          do {
            fVar31 = fVar31 + *(float *)((long)pbVar24 + lVar27) *
                              *(float *)((long)calcAccelerationDeltasMultiDof::Y_minus_hT_a + lVar27
                                        );
            output[lVar23 + lVar28 + 6] = fVar31;
            lVar27 = lVar27 + 4;
          } while (lVar22 * 4 - lVar27 != 0);
          lVar28 = lVar28 + 1;
          pbVar24 = pbVar24 + lVar22;
        } while (lVar28 != lVar22);
      }
      if (0 < iVar7) {
        uVar37 = *(undefined8 *)(outVec_00->m_topVec).m_floats;
        fVar31 = (float)uVar37;
        fVar33 = (float)((ulong)uVar37 >> 0x20);
        bVar32 = (outVec_00->m_topVec).m_floats[2];
        uVar37 = *(undefined8 *)(outVec_00->m_bottomVec).m_floats;
        fVar35 = (float)uVar37;
        fVar36 = (float)((ulong)uVar37 >> 0x20);
        bVar34 = (outVec_00->m_bottomVec).m_floats[2];
        lVar28 = 0;
        do {
          fVar3 = *(float *)((long)output + lVar28 + lVar23 * 4 + 0x18);
          bVar32 = bVar32 + *(float *)((long)(pbVar12->m_inertiaLocal).m_floats +
                                      lVar28 * 8 + lVar29 + -0x14) * fVar3;
          bVar34 = bVar34 + *(float *)((long)(pbVar12->m_inertiaLocal).m_floats +
                                      lVar28 * 8 + lVar29 + -4) * fVar3;
          uVar37 = *(undefined8 *)
                    ((long)(pbVar12->m_inertiaLocal).m_floats + lVar28 * 8 + lVar29 + -0x1c);
          uVar5 = *(undefined8 *)
                   ((long)(pbVar12->m_inertiaLocal).m_floats + lVar28 * 8 + lVar29 + -0xc);
          fVar31 = fVar31 + (float)uVar37 * fVar3;
          fVar33 = fVar33 + (float)((ulong)uVar37 >> 0x20) * fVar3;
          fVar35 = fVar35 + (float)uVar5 * fVar3;
          fVar36 = fVar36 + (float)((ulong)uVar5 >> 0x20) * fVar3;
          *(ulong *)(outVec_00->m_topVec).m_floats = CONCAT44(fVar33,fVar31);
          (outVec_00->m_topVec).m_floats[2] = bVar32;
          *(ulong *)(outVec_00->m_bottomVec).m_floats = CONCAT44(fVar36,fVar35);
          (outVec_00->m_bottomVec).m_floats[2] = bVar34;
          lVar28 = lVar28 + 4;
        } while (lVar22 * 4 != lVar28);
      }
      lVar29 = lVar29 + 600;
      lVar23 = lVar21;
    } while (lVar21 != lVar17);
  }
  fVar31 = outVec[lVar17 + 1].m_topVec.m_floats[0];
  fVar33 = outVec[lVar17 + 1].m_topVec.m_floats[1];
  fVar35 = outVec[lVar17 + 1].m_topVec.m_floats[2];
  fVar36 = pbVar11->m_el[1].m_floats[2];
  fVar3 = pbVar11->m_el[0].m_floats[2];
  fVar4 = pbVar11->m_el[2].m_floats[2];
  uVar37 = *(undefined8 *)pbVar11->m_el[0].m_floats;
  uVar5 = *(undefined8 *)pbVar11->m_el[1].m_floats;
  uVar6 = *(undefined8 *)pbVar11->m_el[2].m_floats;
  *(ulong *)output =
       CONCAT44(fVar35 * (float)((ulong)uVar6 >> 0x20) +
                fVar31 * (float)((ulong)uVar37 >> 0x20) + fVar33 * (float)((ulong)uVar5 >> 0x20),
                fVar35 * (float)uVar6 + fVar31 * (float)uVar37 + fVar33 * (float)uVar5);
  output[2] = fVar4 * fVar35 + fVar3 * fVar31 + fVar36 * fVar33;
  fVar31 = outVec[lVar17 + 1].m_bottomVec.m_floats[0];
  fVar33 = outVec[lVar17 + 1].m_bottomVec.m_floats[1];
  fVar35 = outVec[lVar17 + 1].m_bottomVec.m_floats[2];
  fVar36 = pbVar11->m_el[1].m_floats[2];
  fVar3 = pbVar11->m_el[0].m_floats[2];
  fVar4 = pbVar11->m_el[2].m_floats[2];
  uVar37 = *(undefined8 *)pbVar11->m_el[0].m_floats;
  uVar5 = *(undefined8 *)pbVar11->m_el[1].m_floats;
  uVar6 = *(undefined8 *)pbVar11->m_el[2].m_floats;
  *(ulong *)(output + 3) =
       CONCAT44(fVar35 * (float)((ulong)uVar6 >> 0x20) +
                fVar31 * (float)((ulong)uVar37 >> 0x20) + fVar33 * (float)((ulong)uVar5 >> 0x20),
                fVar35 * (float)uVar6 + fVar31 * (float)uVar37 + fVar33 * (float)uVar5);
  output[5] = fVar4 * fVar35 + fVar3 * fVar31 + fVar36 * fVar33;
  return;
}

Assistant:

void btMultiBody::calcAccelerationDeltasMultiDof(const btScalar *force, btScalar *output,
                                       btAlignedObjectArray<btScalar> &scratch_r, btAlignedObjectArray<btVector3> &scratch_v) const
{
    // Temporary matrices/vectors -- use scratch space from caller
    // so that we don't have to keep reallocating every frame

	
	int num_links = getNumLinks();	
    scratch_r.resize(m_dofCount);
    scratch_v.resize(4*num_links + 4);	    

    btScalar * r_ptr = m_dofCount ? &scratch_r[0] : 0;
    btVector3 * v_ptr = &scratch_v[0];

    // zhat_i^A (scratch space)
    btSpatialForceVector * zeroAccSpatFrc = (btSpatialForceVector *)v_ptr;
	v_ptr += num_links * 2 + 2;

    // rot_from_parent (cached from calcAccelerations)
    const btMatrix3x3 * rot_from_parent = &m_matrixBuf[0];

    // hhat (cached), accel (scratch)
    // hhat is NOT stored for the base (but ahat is) 
	const btSpatialForceVector * h = (btSpatialForceVector *)(m_dofCount > 0 ? &m_vectorBuf[0] : 0);
	btSpatialMotionVector * spatAcc = (btSpatialMotionVector *)v_ptr;
	v_ptr += num_links * 2 + 2;

    // Y_i (scratch), invD_i (cached)
    const btScalar * invD = m_dofCount > 0 ? &m_realBuf[6 + m_dofCount] : 0;
	btScalar * Y = r_ptr; 
	////////////////
	//aux variables
	static btScalar invD_times_Y[6];							//D^{-1} * Y [dofxdof x dofx1 = dofx1] <=> D^{-1} * u; better moved to buffers since it is recalced in calcAccelerationDeltasMultiDof; num_dof of btScalar would cover all bodies
	static btSpatialMotionVector result;							//holds results of the SolveImatrix op; it is a spatial motion vector (accel)
	static btScalar Y_minus_hT_a[6];							//Y - h^{T} * a; it's dofx1 for each body so a single 6x1 temp is enough	
	static btSpatialForceVector spatForceVecTemps[6];				//6 temporary spatial force vectors
	static btSpatialTransformationMatrix fromParent;	
	/////////////////

    // First 'upward' loop.
    // Combines CompTreeLinkVelocities and InitTreeLinks from Mirtich.
	
	// Fill in zero_acc
    // -- set to force/torque on the base, zero otherwise
    if (m_fixedBase) 
	{
        zeroAccSpatFrc[0].setZero();
    } else 
	{	
		//test forces
		fromParent.m_rotMat = rot_from_parent[0];
		fromParent.transformRotationOnly(btSpatialForceVector(-force[0],-force[1],-force[2], -force[3],-force[4],-force[5]), zeroAccSpatFrc[0]);
    }
    for (int i = 0; i < num_links; ++i) 
	{
		zeroAccSpatFrc[i+1].setZero();
    }    

	// 'Downward' loop.
    // (part of TreeForwardDynamics in Mirtich.)
    for (int i = num_links - 1; i >= 0; --i)
	{
		const int parent = m_links[i].m_parent;
		fromParent.m_rotMat = rot_from_parent[i+1]; fromParent.m_trnVec = m_links[i].m_cachedRVector;

		for(int dof = 0; dof < m_links[i].m_dofCount; ++dof)
		{
			Y[m_links[i].m_dofOffset + dof] = force[6 + m_links[i].m_dofOffset + dof]
											- m_links[i].m_axes[dof].dot(zeroAccSpatFrc[i+1])
											;
		}

		btVector3 in_top, in_bottom, out_top, out_bottom;
		const btScalar *invDi = &invD[m_links[i].m_dofOffset*m_links[i].m_dofOffset];
		
		for(int dof = 0; dof < m_links[i].m_dofCount; ++dof)
		{
			invD_times_Y[dof] = 0.f;

			for(int dof2 = 0; dof2 < m_links[i].m_dofCount; ++dof2)
			{
				invD_times_Y[dof] += invDi[dof * m_links[i].m_dofCount + dof2] * Y[m_links[i].m_dofOffset + dof2];				
			}	
		}
		
		 // Zp += pXi * (Zi + hi*Yi/Di)
		spatForceVecTemps[0] = zeroAccSpatFrc[i+1];

		for(int dof = 0; dof < m_links[i].m_dofCount; ++dof)
		{
			const btSpatialForceVector &hDof = h[m_links[i].m_dofOffset + dof];
			//
			spatForceVecTemps[0] += hDof * invD_times_Y[dof];		
		}
		

		fromParent.transformInverse(spatForceVecTemps[0], spatForceVecTemps[1]);
			
		zeroAccSpatFrc[parent+1] += spatForceVecTemps[1];
    }
	
	// ptr to the joint accel part of the output
    btScalar * joint_accel = output + 6;


    // Second 'upward' loop
    // (part of TreeForwardDynamics in Mirtich)

    if (m_fixedBase) 
	{
        spatAcc[0].setZero();
    } 
	else 
	{
		solveImatrix(zeroAccSpatFrc[0], result);
		spatAcc[0] = -result;

    }
	
    // now do the loop over the m_links
    for (int i = 0; i < num_links; ++i)
	{
        const int parent = m_links[i].m_parent;
		fromParent.m_rotMat = rot_from_parent[i+1]; fromParent.m_trnVec = m_links[i].m_cachedRVector;

		fromParent.transform(spatAcc[parent+1], spatAcc[i+1]);
		
		for(int dof = 0; dof < m_links[i].m_dofCount; ++dof)
		{
			const btSpatialForceVector &hDof = h[m_links[i].m_dofOffset + dof];
			//			
			Y_minus_hT_a[dof] = Y[m_links[i].m_dofOffset + dof] - spatAcc[i+1].dot(hDof);
		}

		const btScalar *invDi = &invD[m_links[i].m_dofOffset*m_links[i].m_dofOffset];
		mulMatrix(const_cast<btScalar*>(invDi), Y_minus_hT_a, m_links[i].m_dofCount, m_links[i].m_dofCount, m_links[i].m_dofCount, 1, &joint_accel[m_links[i].m_dofOffset]);

		for(int dof = 0; dof < m_links[i].m_dofCount; ++dof)		
			spatAcc[i+1] += m_links[i].m_axes[dof] * joint_accel[m_links[i].m_dofOffset + dof];      
    }

    // transform base accelerations back to the world frame.
    btVector3 omegadot_out;
    omegadot_out = rot_from_parent[0].transpose() * spatAcc[0].getAngular();
	output[0] = omegadot_out[0];
	output[1] = omegadot_out[1];
	output[2] = omegadot_out[2];

    btVector3 vdot_out;
    vdot_out = rot_from_parent[0].transpose() * spatAcc[0].getLinear();
	output[3] = vdot_out[0];
	output[4] = vdot_out[1];
	output[5] = vdot_out[2];

	/////////////////
	//printf("delta = [");
	//for(int dof = 0; dof < getNumDofs() + 6; ++dof)
	//	printf("%.2f ", output[dof]);
	//printf("]\n");
	/////////////////
}